

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectPivots(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *threshold)

{
  undefined8 *puVar1;
  uint *puVar2;
  undefined1 (*pauVar3) [16];
  int iVar4;
  pointer pnVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  Pring *pPVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  Pring *pPVar17;
  long lVar18;
  Pring *pPVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  type t;
  int local_1dc;
  cpp_dec_float<50U,_int,_void> local_1d8;
  int local_194;
  int local_190;
  int local_18c;
  cpp_dec_float<50U,_int,_void> local_188;
  long local_148;
  ulong local_140;
  cpp_dec_float<50u,int,void> local_138 [8];
  uint auStack_130 [2];
  uint local_128 [2];
  undefined5 uStack_120;
  undefined3 uStack_11b;
  uint local_118 [3];
  byte local_10c;
  undefined8 local_108;
  long local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  cpp_dec_float<50U,_int,_void> *local_e0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_d8;
  Pring *local_d0;
  ulong local_c8;
  long local_c0;
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [2];
  uint auStack_a0 [2];
  uint local_98 [4];
  uint local_88 [2];
  uint auStack_80 [2];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [4];
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  uint auStack_40 [2];
  uint local_38 [2];
  
  local_188.fpclass = cpp_dec_float_finite;
  local_188.prec_elem = 10;
  local_188.data._M_elems[0] = 0;
  local_188.data._M_elems[1] = 0;
  local_188.data._M_elems[2] = 0;
  local_188.data._M_elems[3] = 0;
  local_188.data._M_elems[4] = 0;
  local_188.data._M_elems[5] = 0;
  local_188.data._M_elems[6] = 0;
  local_188.data._M_elems[7] = 0;
  local_188.data._M_elems[8] = 0;
  local_188.data._M_elems[9] = 0;
  local_188.exp = 0;
  local_188.neg = false;
  local_108._0_4_ = cpp_dec_float_finite;
  local_108._4_4_ = 10;
  _local_138 = (undefined1  [16])0x0;
  local_128[0] = 0;
  local_128[1] = 0;
  uStack_120 = 0;
  uStack_11b = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_118[2] = 0;
  local_10c = 0;
  local_e0 = &threshold->m_backend;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(local_138,0.0);
  iVar11 = ~(this->temp).stage + this->thedim;
  local_f0 = 4;
  if (iVar11 < 4) {
    local_f0 = iVar11;
  }
  local_d0 = &(this->temp).pivots;
  local_c8 = 0;
  local_140 = 2;
  local_190 = -1;
  local_18c = -1;
  local_1dc = -1;
  local_d8 = this;
LAB_002a3cac:
  pPVar13 = (this->temp).pivot_rowNZ;
  iVar11 = (int)local_140;
  pPVar19 = pPVar13[iVar11].next;
  pPVar13 = pPVar13 + iVar11;
  if (pPVar19 == pPVar13) {
    pPVar17 = (this->temp).pivot_colNZ + iVar11;
    do {
      if (pPVar17 != pPVar17->next) {
        local_1dc = pPVar17->next->idx;
        iVar11 = (this->temp).s_cact[local_1dc];
        iVar12 = this->thedim + 1;
        if (iVar11 < 1) goto LAB_002a4910;
        local_ec = (int)local_140 + 1;
        iVar16 = (this->u).col.len[local_1dc] + (this->u).col.start[local_1dc] + -1;
        lVar18 = (long)iVar16;
        lVar20 = (long)(iVar16 - iVar11);
        iVar11 = -1;
        local_f8 = lVar20;
        goto LAB_002a4222;
      }
      pPVar19 = pPVar13[1].next;
      pPVar13 = pPVar13 + 1;
      local_140 = (ulong)((int)local_140 + 1);
      pPVar17 = pPVar17 + 1;
    } while (pPVar13 == pPVar19);
  }
  iVar11 = pPVar19->idx;
  iVar12 = (this->u).row.start[iVar11];
  local_148 = (long)iVar12;
  iVar16 = (this->u).row.len[iVar11];
  iVar21 = iVar16 + iVar12 + -1;
  pnVar5 = (this->temp).s_max.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(undefined8 *)((long)pnVar5[iVar11].m_backend.data._M_elems + 0x20);
  local_188.data._M_elems[8] = (uint)uVar6;
  local_188.data._M_elems[9] = (uint)((ulong)uVar6 >> 0x20);
  uVar6 = *(undefined8 *)pnVar5[iVar11].m_backend.data._M_elems;
  uVar7 = *(undefined8 *)((long)pnVar5[iVar11].m_backend.data._M_elems + 8);
  puVar2 = (uint *)((long)pnVar5[iVar11].m_backend.data._M_elems + 0x10);
  uVar8 = *(undefined8 *)puVar2;
  uVar9 = *(undefined8 *)(puVar2 + 2);
  local_188.data._M_elems[4] = (uint)uVar8;
  local_188.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
  local_188.data._M_elems[6] = (uint)uVar9;
  local_188.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
  local_188.data._M_elems[0] = (uint)uVar6;
  local_188.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
  local_188.data._M_elems[2] = (uint)uVar7;
  local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
  local_188.exp = pnVar5[iVar11].m_backend.exp;
  local_188.neg = pnVar5[iVar11].m_backend.neg;
  local_188.fpclass = pnVar5[iVar11].m_backend.fpclass;
  local_188.prec_elem = pnVar5[iVar11].m_backend.prec_elem;
  local_18c = iVar11;
  if (local_188.fpclass != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_1d8,0,(type *)0x0);
    iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_188,&local_1d8);
    if (iVar12 < 0) {
      pnVar5 = (this->u).row.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_188.data._M_elems[0] = pnVar5[iVar21].m_backend.data._M_elems[0];
      local_188.data._M_elems[9] = *(uint *)((long)pnVar5[iVar21].m_backend.data._M_elems + 0x24);
      local_1d8.data._M_elems[8] = local_188.data._M_elems[9];
      puVar2 = (uint *)((long)pnVar5[iVar21].m_backend.data._M_elems + 0x14);
      local_1d8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_1d8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)pnVar5[iVar21].m_backend.data._M_elems + 4);
      local_1d8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_1d8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      local_188.neg = pnVar5[iVar21].m_backend.neg;
      local_188.fpclass = pnVar5[iVar21].m_backend.fpclass;
      local_188.prec_elem = pnVar5[iVar21].m_backend.prec_elem;
      if (local_188.neg == true) {
        local_188.neg = local_188.fpclass == cpp_dec_float_finite && local_188.data._M_elems[0] == 0
        ;
      }
      local_188.exp = pnVar5[iVar21].m_backend.exp;
      local_188.data._M_elems[5] = local_1d8.data._M_elems[4];
      local_188.data._M_elems[6] = local_1d8.data._M_elems[5];
      local_188.data._M_elems[7] = local_1d8.data._M_elems[6];
      local_188.data._M_elems[8] = local_1d8.data._M_elems[7];
      local_188.data._M_elems[1] = local_1d8.data._M_elems[0];
      local_188.data._M_elems[2] = local_1d8.data._M_elems[1];
      local_188.data._M_elems[3] = local_1d8.data._M_elems[2];
      local_188.data._M_elems[4] = local_1d8.data._M_elems[3];
      iVar12 = iVar16 + (int)local_148 + -2;
      if ((int)local_148 <= iVar12) {
        lVar20 = (long)iVar12 + 1;
        lVar24 = (long)iVar12 * 0x38 + 0x30;
        lVar18 = local_148;
        do {
          pnVar5 = (this->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_1d8.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x10);
          puVar2 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x30);
          local_1d8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          local_1d8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x20);
          local_1d8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_1d8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_1d8.exp = *(int *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -8);
          local_1d8.neg = *(bool *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -4);
          local_1d8._48_8_ = *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24);
          if ((local_1d8.neg == true) &&
             (local_1d8.data._M_elems[0] != 0 || local_1d8.fpclass != cpp_dec_float_finite)) {
            local_1d8.neg = false;
          }
          local_58 = (uint  [2])local_1d8.data._M_elems._0_8_;
          auStack_50 = (uint  [2])local_1d8.data._M_elems._8_8_;
          local_48 = (uint  [2])local_1d8.data._M_elems._16_8_;
          auStack_40 = (uint  [2])local_1d8.data._M_elems._24_8_;
          local_38 = (uint  [2])local_1d8.data._M_elems._32_8_;
          if (((local_188.fpclass != cpp_dec_float_NaN) && (local_1d8.fpclass != cpp_dec_float_NaN))
             && (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_188,&local_1d8), lVar18 = local_148, iVar12 < 0)) {
            pnVar5 = (this->u).row.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_188.data._M_elems[0] =
                 *(uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x30);
            local_188.data._M_elems[9] =
                 *(uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0xc);
            local_1d8.data._M_elems[8] = local_188.data._M_elems[9];
            puVar2 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x1c);
            local_1d8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_1d8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x2c);
            local_1d8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_1d8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            local_188.neg = *(bool *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -4);
            local_188._48_8_ = *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24);
            if (local_188.neg == true) {
              local_188.neg =
                   local_188.fpclass == cpp_dec_float_finite && local_188.data._M_elems[0] == 0;
            }
            local_188.exp = *(int *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -8);
            local_188.data._M_elems[5] = local_1d8.data._M_elems[4];
            local_188.data._M_elems[6] = local_1d8.data._M_elems[5];
            local_188.data._M_elems[7] = local_1d8.data._M_elems[6];
            local_188.data._M_elems[8] = local_1d8.data._M_elems[7];
            local_188.data._M_elems[1] = local_1d8.data._M_elems[0];
            local_188.data._M_elems[2] = local_1d8.data._M_elems[1];
            local_188.data._M_elems[3] = local_1d8.data._M_elems[2];
            local_188.data._M_elems[4] = local_1d8.data._M_elems[3];
          }
          lVar20 = lVar20 + -1;
          lVar24 = lVar24 + -0x38;
        } while (lVar18 < lVar20);
      }
      pnVar5 = (this->temp).s_max.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)pnVar5[iVar11].m_backend.data._M_elems + 0x20) =
           CONCAT44(local_188.data._M_elems[9],local_188.data._M_elems[8]);
      puVar2 = (uint *)((long)pnVar5[iVar11].m_backend.data._M_elems + 0x10);
      *(ulong *)puVar2 = CONCAT44(local_188.data._M_elems[5],local_188.data._M_elems[4]);
      *(ulong *)(puVar2 + 2) = CONCAT44(local_188.data._M_elems[7],local_188.data._M_elems[6]);
      *(ulong *)pnVar5[iVar11].m_backend.data._M_elems =
           CONCAT44(local_188.data._M_elems[1],local_188.data._M_elems[0]);
      *(ulong *)((long)pnVar5[iVar11].m_backend.data._M_elems + 8) =
           CONCAT44(local_188.data._M_elems[3],local_188.data._M_elems[2]);
      pnVar5[iVar11].m_backend.exp = local_188.exp;
      pnVar5[iVar11].m_backend.neg = local_188.neg;
      pnVar5[iVar11].m_backend.fpclass = local_188.fpclass;
      pnVar5[iVar11].m_backend.prec_elem = local_188.prec_elem;
    }
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_188,local_e0);
  iVar12 = this->thedim + 1;
  if (iVar16 < 1) {
LAB_002a4910:
    iVar11 = -1;
  }
  else {
    lVar18 = (long)iVar21 + 1;
    lVar24 = (long)iVar21 * 0xe + 0xd;
    local_194 = -1;
    lVar20 = local_148;
    do {
      pnVar5 = (this->u).row.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar16 = (this->u).row.idx[lVar18 + -1];
      iVar4 = (this->temp).s_cact[iVar16];
      local_118._0_8_ =
           *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 * 4 + -0x14);
      pauVar3 = (undefined1 (*) [16])((long)(pnVar5->m_backend).data._M_elems + lVar24 * 4 + -0x34);
      uVar6 = *(undefined8 *)*pauVar3;
      uVar7 = *(undefined8 *)(*pauVar3 + 8);
      _local_138 = *pauVar3;
      puVar2 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 * 4 + -0x24);
      local_128 = *(uint (*) [2])puVar2;
      uVar8 = *(undefined8 *)(puVar2 + 2);
      uStack_120 = (undefined5)uVar8;
      uStack_11b = SUB83(uVar8,5);
      local_118[2] = *(int *)((long)(pnVar5->m_backend).data._M_elems + lVar24 * 4 + -0xc);
      local_10c = *(byte *)((long)(pnVar5->m_backend).data._M_elems + lVar24 * 4 + -8);
      local_108._0_4_ = *(fpclass_type *)((long)(pnVar5->m_backend).data._M_elems + lVar24 * 4 + -4)
      ;
      local_108._4_4_ = *(int32_t *)((long)(pnVar5->m_backend).data._M_elems + lVar24 * 4);
      if (iVar4 < iVar12) {
        local_1d8.prec_elem = local_108._4_4_;
        local_1d8.fpclass = (fpclass_type)local_108;
        local_1d8.neg = (bool)local_10c;
        if ((local_10c != 0) &&
           (local_1d8.data._M_elems[0] = (uint)uVar6,
           local_1d8.data._M_elems[0] != 0 || (fpclass_type)local_108 != cpp_dec_float_finite)) {
          local_1d8.neg = (bool)(local_10c ^ 1);
        }
        this = local_d8;
        local_1d8.data._M_elems._0_8_ = uVar6;
        local_1d8.data._M_elems._8_8_ = uVar7;
        local_1d8.data._M_elems._16_8_ = local_128;
        local_1d8.data._M_elems._24_8_ = uVar8;
        local_1d8.data._M_elems._32_8_ = local_118._0_8_;
        local_1d8.exp = local_118[2];
        if (((((fpclass_type)local_108 != cpp_dec_float_NaN) &&
             (local_188.fpclass != cpp_dec_float_NaN)) &&
            (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_1d8,&local_188), lVar20 = local_148, this = local_d8,
            0 < iVar11)) &&
           (iVar11 = iVar21, iVar12 = iVar4, local_1dc = iVar16, local_194 = iVar21,
           iVar4 <= (int)local_140)) break;
      }
      iVar21 = iVar21 + -1;
      lVar18 = lVar18 + -1;
      lVar24 = lVar24 + -0xe;
      iVar11 = local_194;
    } while (lVar20 < lVar18);
  }
  goto LAB_002a4918;
LAB_002a4222:
  do {
    iVar16 = (this->u).col.idx[lVar18];
    lVar24 = (long)iVar16;
    iVar21 = (this->u).row.len[lVar24];
    if (iVar21 < iVar12) {
      pnVar5 = (this->temp).s_max.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_148 = lVar24 * 0x38;
      local_194 = iVar12;
      local_e8 = iVar21;
      local_e4 = iVar16;
      if (pnVar5[lVar24].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_002a4399:
        iVar12 = (this->u).row.start[lVar24];
        lVar20 = (long)iVar12;
        pnVar5 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_188.data._M_elems[0] = pnVar5[lVar20].m_backend.data._M_elems[0];
        local_188.data._M_elems[9] = *(uint *)((long)pnVar5[lVar20].m_backend.data._M_elems + 0x24);
        local_1d8.data._M_elems[8] = local_188.data._M_elems[9];
        puVar2 = (uint *)((long)pnVar5[lVar20].m_backend.data._M_elems + 0x14);
        local_1d8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_1d8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)pnVar5[lVar20].m_backend.data._M_elems + 4);
        local_1d8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
        local_1d8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
        local_188.neg = pnVar5[lVar20].m_backend.neg;
        local_188.fpclass = pnVar5[lVar20].m_backend.fpclass;
        local_188.prec_elem = pnVar5[lVar20].m_backend.prec_elem;
        if (local_188.neg == true) {
          local_188.neg =
               local_188.fpclass == cpp_dec_float_finite && local_188.data._M_elems[0] == 0;
        }
        local_188.exp = pnVar5[lVar20].m_backend.exp;
        local_188.data._M_elems[5] = local_1d8.data._M_elems[4];
        local_188.data._M_elems[6] = local_1d8.data._M_elems[5];
        local_188.data._M_elems[7] = local_1d8.data._M_elems[6];
        local_188.data._M_elems[8] = local_1d8.data._M_elems[7];
        local_188.data._M_elems[1] = local_1d8.data._M_elems[0];
        local_188.data._M_elems[2] = local_1d8.data._M_elems[1];
        local_188.data._M_elems[3] = local_1d8.data._M_elems[2];
        local_188.data._M_elems[4] = local_1d8.data._M_elems[3];
        lVar24 = (long)((this->u).row.len[lVar24] + iVar12);
        lVar22 = lVar24 << 0x20;
        lVar14 = lVar24 * 0x38;
        local_c0 = lVar18;
        do {
          lVar18 = lVar14;
          lVar25 = lVar22;
          lVar15 = lVar24;
          if (lVar15 <= lVar20) goto LAB_002a463a;
          pnVar5 = (this->u).row.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_1d8.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar18 + -0x18);
          puVar2 = (uint *)((long)pnVar5[-1].m_backend.data._M_elems + lVar18);
          local_1d8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          local_1d8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)(&(pnVar5->m_backend).data + 0xffffffffffffffff) + lVar18);
          local_1d8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_1d8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_1d8.exp = *(int *)((long)(pnVar5->m_backend).data._M_elems + lVar18 + -0x10);
          local_1d8.neg = *(bool *)((long)(pnVar5->m_backend).data._M_elems + lVar18 + -0xc);
          local_1d8._48_8_ = *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar18 + -8);
          if ((local_1d8.neg == true) &&
             (local_1d8.data._M_elems[0] != 0 || local_1d8.fpclass != cpp_dec_float_finite)) {
            local_1d8.neg = false;
          }
          local_88 = (uint  [2])local_1d8.data._M_elems._0_8_;
          auStack_80 = (uint  [2])local_1d8.data._M_elems._8_8_;
          local_78 = (uint  [2])local_1d8.data._M_elems._16_8_;
          auStack_70 = (uint  [2])local_1d8.data._M_elems._24_8_;
          local_68._0_8_ = local_1d8.data._M_elems._32_8_;
          if (((local_188.fpclass != cpp_dec_float_NaN) && (local_1d8.fpclass != cpp_dec_float_NaN))
             && (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_188,&local_1d8), iVar16 < 0)) {
            pnVar5 = (this->u).row.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_188.data._M_elems[0] =
                 *(uint *)((long)pnVar5[-1].m_backend.data._M_elems + lVar18);
            local_188.data._M_elems[9] =
                 *(uint *)((long)(pnVar5->m_backend).data._M_elems + lVar18 + -0x14);
            local_1d8.data._M_elems[8] = local_188.data._M_elems[9];
            puVar2 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar18 + -0x24);
            local_1d8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_1d8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar18 + -0x34);
            local_1d8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_1d8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            local_188.neg = *(bool *)((long)(pnVar5->m_backend).data._M_elems + lVar18 + -0xc);
            local_188._48_8_ =
                 *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar18 + -8);
            if (local_188.neg == true) {
              local_188.neg =
                   local_188.fpclass == cpp_dec_float_finite && local_188.data._M_elems[0] == 0;
            }
            local_188.exp = *(int *)((long)(pnVar5->m_backend).data._M_elems + lVar18 + -0x10);
            local_188.data._M_elems[5] = local_1d8.data._M_elems[4];
            local_188.data._M_elems[6] = local_1d8.data._M_elems[5];
            local_188.data._M_elems[7] = local_1d8.data._M_elems[6];
            local_188.data._M_elems[8] = local_1d8.data._M_elems[7];
            local_188.data._M_elems[1] = local_1d8.data._M_elems[0];
            local_188.data._M_elems[2] = local_1d8.data._M_elems[1];
            local_188.data._M_elems[3] = local_1d8.data._M_elems[2];
            local_188.data._M_elems[4] = local_1d8.data._M_elems[3];
          }
          lVar24 = lVar15 + -1;
          lVar22 = lVar25 + -0x100000000;
          lVar14 = lVar18 + -0x38;
        } while ((this->u).row.idx[lVar15 + -1] != local_1dc);
        pnVar5 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_118._0_8_ = *(undefined8 *)((long)pnVar5[-1].m_backend.data._M_elems + lVar18 + 0x20);
        _local_138 = *(undefined1 (*) [16])((long)pnVar5[-1].m_backend.data._M_elems + lVar18);
        puVar2 = (uint *)((long)pnVar5[-1].m_backend.data._M_elems + lVar18 + 0x10);
        local_128 = *(uint (*) [2])puVar2;
        uVar6 = *(undefined8 *)(puVar2 + 2);
        uStack_120 = (undefined5)uVar6;
        uStack_11b = (undefined3)((ulong)uVar6 >> 0x28);
        local_118[2] = *(int *)((long)(&pnVar5[-1].m_backend.data + 1) + lVar18);
        local_10c = *(byte *)((long)(&pnVar5[-1].m_backend.data + 1) + 4U + lVar18);
        local_108 = *(undefined8 *)((long)(&pnVar5[-1].m_backend.data + 1) + 8U + lVar18);
        local_190 = (int)(lVar15 + -1);
LAB_002a463a:
        lVar18 = local_c0;
        if (iVar12 < (int)lVar15 + -2) {
          lVar25 = lVar25 >> 0x20;
          lVar22 = lVar25 + -2;
          lVar24 = lVar25 * 0x38 + -0x40;
          do {
            pnVar5 = (this->u).row.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1d8.data._M_elems._32_8_ =
                 *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x10);
            puVar2 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x30);
            local_1d8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_1d8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x20);
            local_1d8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_1d8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_1d8.exp = *(int *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -8);
            local_1d8.neg = *(bool *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -4);
            local_1d8._48_8_ = *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24);
            if ((local_1d8.neg == true) &&
               (local_1d8.data._M_elems[0] != 0 || local_1d8.fpclass != cpp_dec_float_finite)) {
              local_1d8.neg = false;
            }
            local_b8 = (uint  [2])local_1d8.data._M_elems._0_8_;
            auStack_b0 = (uint  [2])local_1d8.data._M_elems._8_8_;
            local_a8 = (uint  [2])local_1d8.data._M_elems._16_8_;
            auStack_a0 = (uint  [2])local_1d8.data._M_elems._24_8_;
            local_98._0_8_ = local_1d8.data._M_elems._32_8_;
            if (((local_188.fpclass != cpp_dec_float_NaN) &&
                (local_1d8.fpclass != cpp_dec_float_NaN)) &&
               (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_188,&local_1d8), iVar12 < 0)) {
              pnVar5 = (this->u).row.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_188.data._M_elems[0] =
                   *(uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x30);
              local_188.data._M_elems[9] =
                   *(uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0xc);
              local_1d8.data._M_elems[8] = local_188.data._M_elems[9];
              puVar2 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x1c);
              local_1d8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_1d8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -0x2c);
              local_1d8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_1d8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              local_188.neg = *(bool *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -4);
              local_188._48_8_ = *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar24);
              if (local_188.neg == true) {
                local_188.neg =
                     local_188.fpclass == cpp_dec_float_finite && local_188.data._M_elems[0] == 0;
              }
              local_188.exp = *(int *)((long)(pnVar5->m_backend).data._M_elems + lVar24 + -8);
              local_188.data._M_elems[5] = local_1d8.data._M_elems[4];
              local_188.data._M_elems[6] = local_1d8.data._M_elems[5];
              local_188.data._M_elems[7] = local_1d8.data._M_elems[6];
              local_188.data._M_elems[8] = local_1d8.data._M_elems[7];
              local_188.data._M_elems[1] = local_1d8.data._M_elems[0];
              local_188.data._M_elems[2] = local_1d8.data._M_elems[1];
              local_188.data._M_elems[3] = local_1d8.data._M_elems[2];
              local_188.data._M_elems[4] = local_1d8.data._M_elems[3];
            }
            lVar22 = lVar22 + -1;
            lVar24 = lVar24 + -0x38;
          } while (lVar20 < lVar22);
        }
        pnVar5 = (this->temp).s_max.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)(pnVar5->m_backend).data._M_elems + local_148 + 0x20) =
             CONCAT44(local_188.data._M_elems[9],local_188.data._M_elems[8]);
        puVar1 = (undefined8 *)((long)(pnVar5->m_backend).data._M_elems + local_148 + 0x10);
        *puVar1 = CONCAT44(local_188.data._M_elems[5],local_188.data._M_elems[4]);
        puVar1[1] = CONCAT44(local_188.data._M_elems[7],local_188.data._M_elems[6]);
        puVar1 = (undefined8 *)((long)(pnVar5->m_backend).data._M_elems + local_148);
        *puVar1 = CONCAT44(local_188.data._M_elems[1],local_188.data._M_elems[0]);
        puVar1[1] = CONCAT44(local_188.data._M_elems[3],local_188.data._M_elems[2]);
        *(int *)((long)(&(pnVar5->m_backend).data + 1) + local_148) = local_188.exp;
        *(bool *)((long)(&(pnVar5->m_backend).data + 1) + 4U + local_148) = local_188.neg;
        *(undefined8 *)((long)(&(pnVar5->m_backend).data + 1) + 8U + local_148) = local_188._48_8_;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_1d8,0,(type *)0x0);
        lVar20 = local_148;
        iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&pnVar5[lVar24].m_backend,&local_1d8);
        if (iVar12 < 1) goto LAB_002a4399;
        iVar12 = (this->u).row.start[lVar24];
        lVar22 = (long)((this->u).row.len[lVar24] + iVar12);
        lVar24 = lVar22 * 0xe + 0xc;
        do {
          lVar14 = lVar24;
          if (lVar22 <= iVar12) goto LAB_002a4346;
          lVar15 = lVar22 + -1;
          lVar25 = lVar22 + -1;
          lVar24 = lVar14 + -0xe;
          lVar22 = lVar15;
        } while ((this->u).row.idx[lVar25] != local_1dc);
        pnVar5 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_118._0_8_ = *(undefined8 *)((long)(&pnVar5[-2].m_backend.data + 1) + lVar14 * 4);
        _local_138 = *(undefined1 (*) [16])
                      ((long)pnVar5[-2].m_backend.data._M_elems + lVar14 * 4 + 8);
        puVar2 = (uint *)((long)pnVar5[-2].m_backend.data._M_elems + lVar14 * 4 + 0x18);
        local_128 = *(uint (*) [2])puVar2;
        uVar6 = *(undefined8 *)(puVar2 + 2);
        uStack_120 = (undefined5)uVar6;
        uStack_11b = (undefined3)((ulong)uVar6 >> 0x28);
        local_118[2] = *(int *)((long)(&pnVar5[-2].m_backend.data + 1) + 8U + lVar14 * 4);
        local_10c = *(byte *)((long)(&pnVar5[-2].m_backend.data + 1) + 0xcU + lVar14 * 4);
        local_108 = *(undefined8 *)((long)pnVar5[-1].m_backend.data._M_elems + lVar14 * 4);
        local_190 = (int)lVar15;
LAB_002a4346:
        pnVar5 = (this->temp).s_max.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar20 + 0x20);
        local_188.data._M_elems[8] = (uint)uVar6;
        local_188.data._M_elems[9] = (uint)((ulong)uVar6 >> 0x20);
        puVar1 = (undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar20);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar20 + 0x10);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        local_188.data._M_elems[4] = (uint)uVar8;
        local_188.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
        local_188.data._M_elems[6] = (uint)uVar9;
        local_188.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
        local_188.data._M_elems[0] = (uint)uVar6;
        local_188.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
        local_188.data._M_elems[2] = (uint)uVar7;
        local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
        local_188.exp = *(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar20);
        local_188.neg = *(bool *)((long)(&(pnVar5->m_backend).data + 1) + 4U + lVar20);
        local_188._48_8_ = *(undefined8 *)((long)(&(pnVar5->m_backend).data + 1) + 8U + lVar20);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_188,local_e0);
      auVar10 = _local_138;
      local_1d8.data._M_elems[8] = local_118[0];
      local_1d8.data._M_elems[9] = local_118[1];
      local_1d8.data._M_elems[7]._1_3_ = uStack_11b;
      local_1d8.data._M_elems._24_5_ = uStack_120;
      local_1d8.data._M_elems[4] = local_128[0];
      local_1d8.data._M_elems[5] = local_128[1];
      local_1d8.data._M_elems._0_8_ = local_138;
      uVar6 = local_1d8.data._M_elems._0_8_;
      local_1d8.data._M_elems[2] = auStack_130[0];
      local_1d8.data._M_elems[3] = auStack_130[1];
      local_1d8.exp = local_118[2];
      local_1d8.neg = (bool)local_10c;
      local_1d8.fpclass = (fpclass_type)local_108;
      local_1d8.prec_elem = local_108._4_4_;
      if ((local_10c == 1) &&
         (local_1d8.data._M_elems[0] = auVar10._0_4_,
         local_1d8.data._M_elems[0] != 0 || (fpclass_type)local_108 != cpp_dec_float_finite)) {
        local_1d8.neg = false;
      }
      lVar20 = local_f8;
      iVar12 = local_194;
      local_1d8.data._M_elems._0_8_ = uVar6;
      _local_138 = auVar10;
      if ((((fpclass_type)local_108 != cpp_dec_float_NaN) &&
          (local_188.fpclass != cpp_dec_float_NaN)) &&
         (iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_1d8,&local_188), lVar20 = local_f8, iVar12 = local_194,
         0 < iVar16)) {
        local_18c = local_e4;
        iVar11 = local_190;
        iVar12 = local_e8;
        if (local_e8 <= local_ec) break;
      }
    }
    lVar18 = lVar18 + -1;
  } while (lVar20 < lVar18);
LAB_002a4918:
  pPVar13 = (this->temp).pivot_col;
  lVar18 = (long)local_1dc;
  pPVar19 = pPVar13[lVar18].next;
  pPVar19->prev = pPVar13[lVar18].prev;
  (pPVar13[lVar18].prev)->next = pPVar19;
  pPVar13[lVar18].next = pPVar13 + lVar18;
  pPVar13[lVar18].prev = pPVar13 + lVar18;
  if (-1 < iVar11) {
    lVar18 = (long)local_18c;
    pPVar13 = (this->temp).pivot_row;
    pPVar13[lVar18].pos = iVar11 - (this->u).row.start[lVar18];
    iVar11 = ((int)local_140 + -1) * (iVar12 + -1);
    pPVar13[lVar18].mkwtz = iVar11;
    pPVar19 = local_d0;
    do {
      pPVar19 = pPVar19->next;
      if ((pPVar19->idx < 0) || (pPVar19->idx == local_18c)) break;
    } while (pPVar19->mkwtz < iVar11);
    pPVar19 = pPVar19->prev;
    if (pPVar19->idx != local_18c) {
      pPVar17 = pPVar13[lVar18].next;
      pPVar17->prev = pPVar13[lVar18].prev;
      (pPVar13[lVar18].prev)->next = pPVar17;
      pPVar17 = pPVar19->next;
      pPVar13[lVar18].next = pPVar17;
      pPVar17->prev = pPVar13 + lVar18;
      pPVar13[lVar18].prev = pPVar19;
      pPVar19->next = pPVar13 + lVar18;
    }
    uVar23 = (int)local_c8 + 1;
    local_c8 = (ulong)uVar23;
    if (local_f0 <= (int)uVar23) {
      return;
    }
  }
  goto LAB_002a3cac;
}

Assistant:

void CLUFactor<R>::selectPivots(R threshold)
{
   int ii;
   int i;
   int j;
   int k;
   int ll = -1; // This value should never be used.
   int kk;
   int m;
   int count;
   int num;
   int rw = -1; // This value should never be used.
   int cl = -1; // This value should never be used.
   int len;
   int beg;
   R l_maxabs;
   R x = R(0.0);   // This value should never be used.
   int mkwtz;
   int candidates;

   candidates = thedim - temp.stage - 1;

   if(candidates > 4)
      candidates = 4;

   num = 0;

   count = 2;

   for(;;)
   {
      ii = -1;

      if(temp.pivot_rowNZ[count].next != &(temp.pivot_rowNZ[count]))
      {
         rw = temp.pivot_rowNZ[count].next->idx;
         beg = u.row.start[rw];
         len = u.row.len[rw] + beg - 1;

         /*  set l_maxabs to maximum absolute value in row
          *  (compute it if necessary).
          */

         if((l_maxabs = temp.s_max[rw]) < 0)
         {
            l_maxabs = spxAbs(u.row.val[len]);

            for(i = len - 1; i >= beg; --i)
               if(l_maxabs < spxAbs(u.row.val[i]))
                  l_maxabs = spxAbs(u.row.val[i]);

            temp.s_max[rw] = l_maxabs;               /* ##### */
         }

         l_maxabs *= threshold;

         /*  select pivot element with lowest markowitz number in row
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.row.idx[i];
            j = temp.s_cact[k];
            x = u.row.val[i];

            if(j < mkwtz && spxAbs(x) > l_maxabs)
            {
               mkwtz = j;
               cl = k;
               ii = i;

               if(j <= count)               /* ##### */
                  break;
            }
         }
      }
      else if(temp.pivot_colNZ[count].next != &(temp.pivot_colNZ[count]))
      {
         cl = temp.pivot_colNZ[count].next->idx;
         beg = u.col.start[cl];
         len = u.col.len[cl] + beg - 1;
         beg = len - temp.s_cact[cl] + 1;
         assert(count == temp.s_cact[cl]);

         /*  select pivot element with lowest markowitz number in column
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.col.idx[i];
            j = u.row.len[k];

            if(j < mkwtz)
            {
               /*  ensure that element (cl,k) is stable.
                */
               if(temp.s_max[k] > 0)
               {
                  /*  case 1: l_maxabs is known
                   */
                  for(m = u.row.start[k], kk = m + u.row.len[k] - 1;
                        kk >= m; --kk)
                  {
                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  l_maxabs = temp.s_max[k];
               }
               else
               {
                  /*  case 2: l_maxabs needs to be computed
                   */
                  m = u.row.start[k];
                  l_maxabs = spxAbs(u.row.val[m]);

                  for(kk = m + u.row.len[k] - 1; kk >= m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);

                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  for(--kk; kk > m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);
                  }

                  temp.s_max[k] = l_maxabs;
               }

               l_maxabs *= threshold;

               if(spxAbs(x) > l_maxabs)
               {
                  mkwtz = j;
                  rw = k;
                  ii = ll;

                  if(j <= count + 1)
                     break;
               }
            }
         }
      }
      else
      {
         ++count;
         continue;
      }

      assert(cl >= 0);

      removeDR(temp.pivot_col[cl]);
      initDR(temp.pivot_col[cl]);

      if(ii >= 0)
      {
         /*  Initialize selected pivot element
          */
         CLUFactor<R>::Pring* pr;
         temp.pivot_row[rw].pos = ii - u.row.start[rw];
         temp.pivot_row[rw].mkwtz = mkwtz = (mkwtz - 1) * (count - 1);
         // ??? mkwtz originally was long,
         // maybe to avoid an overflow in this instruction?

         for(pr = temp.pivots.next; pr->idx >= 0; pr = pr->next)
         {
            if(pr->idx == rw || pr->mkwtz >= mkwtz)
               break;
         }

         pr = pr->prev;

         if(pr->idx != rw)
         {
            removeDR(temp.pivot_row[rw]);
            init2DR(temp.pivot_row[rw], *pr);
         }

         num++;

         if(num >= candidates)
            break;
      }
   }

   /*
    *     while(temp.temp.next->mkwtz < temp.temp.prev->mkwtz)
    *     {
    *     Pring   *pr;
    *     pr = temp.temp.prev;
    *     removeDR(*pr);
    *     init2DR (*pr, rowNZ[u.row.len[pr->idx]]);
    }
    */

   assert(row.perm[rw] < 0);

   assert(col.perm[cl] < 0);
}